

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CNameExpression *expression)

{
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  CNameExpression *local_18;
  CNameExpression *expression_local;
  CEseqFloatVisitor *this_local;
  
  local_18 = expression;
  expression_local = (CNameExpression *)this;
  (*(expression->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
            (&this->childExpression,&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CNameExpression &expression) {
    childExpression = std::move(expression.Copy());
}